

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::formatGLSL_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *templateString,
          FormatArgumentList *args)

{
  string *extraout_RAX;
  string *psVar1;
  allocator<char> local_59;
  undefined1 local_58 [32];
  StringTemplate local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,(char *)this,&local_59);
  tcu::StringTemplate::StringTemplate(&local_38,(string *)local_58);
  tcu::StringTemplate::specialize
            (__return_storage_ptr__,&local_38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)templateString);
  tcu::StringTemplate::~StringTemplate(&local_38);
  psVar1 = (string *)(local_58 + 0x10);
  if ((string *)local_58._0_8_ != psVar1) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

static std::string formatGLSL (const char* templateString, const FormatArgumentList& args)
{
	const std::map<std::string, std::string>& params = args.getArguments();

	return tcu::StringTemplate(std::string(templateString)).specialize(params);
}